

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

CoinStatsHashType ParseHashType(string *hash_type_input)

{
  int iVar1;
  uint uVar2;
  CoinStatsHashType CVar3;
  UniValue *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (hash_type_input,"hash_serialized_3");
  if (iVar1 == 0) {
    CVar3 = HASH_SERIALIZED;
  }
  else {
    iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (hash_type_input,"muhash");
    if (iVar1 == 0) {
      CVar3 = MUHASH;
    }
    else {
      uVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(hash_type_input,"none");
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)uVar2;
      CVar3 = NONE;
      if (uVar2 != 0) {
        __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
        tinyformat::format<std::__cxx11::string>
                  (&local_40,(tinyformat *)"\'%s\' is not a valid hash_type",(char *)hash_type_input
                   ,args);
        JSONRPCError(__return_storage_ptr__,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_0029d9fa;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return CVar3;
  }
LAB_0029d9fa:
  __stack_chk_fail();
}

Assistant:

CoinStatsHashType ParseHashType(const std::string& hash_type_input)
{
    if (hash_type_input == "hash_serialized_3") {
        return CoinStatsHashType::HASH_SERIALIZED;
    } else if (hash_type_input == "muhash") {
        return CoinStatsHashType::MUHASH;
    } else if (hash_type_input == "none") {
        return CoinStatsHashType::NONE;
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("'%s' is not a valid hash_type", hash_type_input));
    }
}